

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaValidateFacetInternal
              (xmlSchemaFacetPtr facet,xmlSchemaWhitespaceValueType fws,xmlSchemaValType valType,
              xmlChar *value,xmlSchemaValPtr val,xmlSchemaWhitespaceValueType ws)

{
  xmlGenericErrorFunc p_Var1;
  bool bVar2;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlChar *local_60;
  uint local_40;
  uint len;
  int stringType;
  int ret;
  xmlSchemaWhitespaceValueType ws_local;
  xmlSchemaValPtr val_local;
  xmlChar *value_local;
  xmlSchemaValType valType_local;
  xmlSchemaWhitespaceValueType fws_local;
  xmlSchemaFacetPtr facet_local;
  
  if (facet == (xmlSchemaFacetPtr)0x0) {
    return -1;
  }
  switch(facet->type) {
  case XML_SCHEMA_FACET_MININCLUSIVE:
    iVar3 = xmlSchemaCompareValues(val,facet->val);
    if (iVar3 == -2) {
      facet_local._4_4_ = -1;
    }
    else if ((iVar3 == 1) || (iVar3 == 0)) {
      facet_local._4_4_ = 0;
    }
    else {
      facet_local._4_4_ = 0x729;
    }
    break;
  case XML_SCHEMA_FACET_MINEXCLUSIVE:
    iVar3 = xmlSchemaCompareValues(val,facet->val);
    if (iVar3 == -2) {
      facet_local._4_4_ = -1;
    }
    else if (iVar3 == 1) {
      facet_local._4_4_ = 0;
    }
    else {
      facet_local._4_4_ = 0x72b;
    }
    break;
  case XML_SCHEMA_FACET_MAXINCLUSIVE:
    iVar3 = xmlSchemaCompareValues(val,facet->val);
    if (iVar3 == -2) {
      facet_local._4_4_ = -1;
    }
    else if ((iVar3 == -1) || (iVar3 == 0)) {
      facet_local._4_4_ = 0;
    }
    else {
      facet_local._4_4_ = 0x72a;
    }
    break;
  case XML_SCHEMA_FACET_MAXEXCLUSIVE:
    iVar3 = xmlSchemaCompareValues(val,facet->val);
    if (iVar3 == -2) {
      facet_local._4_4_ = -1;
    }
    else if (iVar3 == -1) {
      facet_local._4_4_ = 0;
    }
    else {
      facet_local._4_4_ = 0x72c;
    }
    break;
  case XML_SCHEMA_FACET_TOTALDIGITS:
  case XML_SCHEMA_FACET_FRACTIONDIGITS:
    if (((facet->val == (xmlSchemaValPtr)0x0) ||
        ((facet->val->type != XML_SCHEMAS_PINTEGER && (facet->val->type != XML_SCHEMAS_NNINTEGER))))
       || ((*(ushort *)((long)&facet->val->value + 0x1c) >> 1 & 0x7f) != 0)) {
      return -1;
    }
    if ((val == (xmlSchemaValPtr)0x0) ||
       ((((((val->type != XML_SCHEMAS_DECIMAL && (val->type != XML_SCHEMAS_INTEGER)) &&
           (val->type != XML_SCHEMAS_NPINTEGER)) &&
          ((val->type != XML_SCHEMAS_NINTEGER && (val->type != XML_SCHEMAS_NNINTEGER)))) &&
         ((val->type != XML_SCHEMAS_PINTEGER &&
          ((val->type != XML_SCHEMAS_INT && (val->type != XML_SCHEMAS_UINT)))))) &&
        ((val->type != XML_SCHEMAS_LONG &&
         ((((val->type != XML_SCHEMAS_ULONG && (val->type != XML_SCHEMAS_SHORT)) &&
           (val->type != XML_SCHEMAS_USHORT)) &&
          ((val->type != XML_SCHEMAS_BYTE && (val->type != XML_SCHEMAS_UBYTE)))))))))) {
      return -1;
    }
    if (facet->type == XML_SCHEMA_FACET_TOTALDIGITS) {
      if ((facet->val->value).decimal.lo < (ulong)(*(ushort *)((long)&val->value + 0x1c) >> 8)) {
        return 0x72d;
      }
    }
    else if ((facet->type == XML_SCHEMA_FACET_FRACTIONDIGITS) &&
            ((facet->val->value).decimal.lo <
             (ulong)(*(ushort *)((long)&val->value + 0x1c) >> 1 & 0x7f))) {
      return 0x72e;
    }
    goto LAB_00242029;
  case XML_SCHEMA_FACET_PATTERN:
    if (value == (xmlChar *)0x0) {
      facet_local._4_4_ = -1;
    }
    else {
      bVar2 = false;
      if ((val != (xmlSchemaValPtr)0x0) &&
         (((val->type == XML_SCHEMAS_UNKNOWN || (bVar2 = true, XML_SCHEMAS_NORMSTRING < val->type))
          && (bVar2 = false, XML_SCHEMAS_BOOLEAN < val->type)))) {
        bVar2 = val->type < XML_SCHEMAS_ID;
      }
      local_60 = value;
      if ((bVar2) && ((val->value).decimal.lo != 0)) {
        local_60 = (val->value).qname.name;
      }
      facet_local._4_4_ = xmlRegexpExec(facet->regexp,local_60);
      if (facet_local._4_4_ == 1) {
        facet_local._4_4_ = 0;
      }
      else if (facet_local._4_4_ == 0) {
        facet_local._4_4_ = 0x72f;
      }
    }
    break;
  case XML_SCHEMA_FACET_ENUMERATION:
    if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
      if ((facet->value != (xmlChar *)0x0) && (iVar3 = xmlStrEqual(facet->value,value), iVar3 != 0))
      {
        return 0;
      }
    }
    else {
      iVar3 = xmlSchemaCompareValuesWhtspExt
                        (facet->val->type,facet->val,facet->value,fws,valType,val,value,ws);
      if (iVar3 == -2) {
        return -1;
      }
      if (iVar3 == 0) {
        return 0;
      }
    }
    facet_local._4_4_ = 0x730;
    break;
  case XML_SCHEMA_FACET_WHITESPACE:
    facet_local._4_4_ = 0;
    break;
  case XML_SCHEMA_FACET_LENGTH:
    if ((valType == XML_SCHEMAS_QNAME) || (valType == XML_SCHEMAS_NOTATION)) {
      return 0;
    }
  case XML_SCHEMA_FACET_MAXLENGTH:
  case XML_SCHEMA_FACET_MINLENGTH:
    local_40 = 0;
    if ((valType == XML_SCHEMAS_QNAME) || (valType == XML_SCHEMAS_NOTATION)) {
      return 0;
    }
    if ((facet->val == (xmlSchemaValPtr)0x0) ||
       (((facet->val->type != XML_SCHEMAS_DECIMAL && (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
        ((*(ushort *)((long)&facet->val->value + 0x1c) >> 1 & 0x7f) != 0)))) {
      return -1;
    }
    if ((val == (xmlSchemaValPtr)0x0) || (val->type != XML_SCHEMAS_HEXBINARY)) {
      if ((val == (xmlSchemaValPtr)0x0) || (val->type != XML_SCHEMAS_BASE64BINARY)) {
        if (valType - XML_SCHEMAS_STRING < 2) {
          if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
            if (valType == XML_SCHEMAS_STRING) {
              local_40 = xmlUTF8Strlen(value);
            }
            else {
              local_40 = xmlSchemaNormLen(value);
            }
          }
          else if (value != (xmlChar *)0x0) {
            if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE) {
              local_40 = xmlSchemaNormLen(value);
            }
            else {
              local_40 = xmlUTF8Strlen(value);
            }
          }
        }
        else if (((valType - XML_SCHEMAS_TOKEN < 3) || (valType == XML_SCHEMAS_NAME)) ||
                ((valType - XML_SCHEMAS_NCNAME < 3 || (valType == XML_SCHEMAS_ANYURI)))) {
          if (value != (xmlChar *)0x0) {
            local_40 = xmlSchemaNormLen(value);
          }
        }
        else {
          pp_Var4 = __xmlGenericError();
          p_Var1 = *pp_Var4;
          ppvVar5 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
                    ,0x15a9);
        }
      }
      else {
        local_40 = (val->value).hex.total;
      }
    }
    else {
      local_40 = (val->value).hex.total;
    }
    if (facet->type == XML_SCHEMA_FACET_LENGTH) {
      if ((ulong)local_40 != (facet->val->value).decimal.lo) {
        return 0x726;
      }
    }
    else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
      if ((ulong)local_40 < (facet->val->value).decimal.lo) {
        return 0x727;
      }
    }
    else if ((facet->val->value).decimal.lo < (ulong)local_40) {
      return 0x728;
    }
    goto LAB_00242029;
  default:
    pp_Var4 = __xmlGenericError();
    p_Var1 = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar5,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemastypes.c"
              ,0x15dc);
LAB_00242029:
    facet_local._4_4_ = 0;
  }
  return facet_local._4_4_;
}

Assistant:

static int
xmlSchemaValidateFacetInternal(xmlSchemaFacetPtr facet,
			       xmlSchemaWhitespaceValueType fws,
			       xmlSchemaValType valType,
			       const xmlChar *value,
			       xmlSchemaValPtr val,
			       xmlSchemaWhitespaceValueType ws)
{
    int ret;
    int stringType;

    if (facet == NULL)
	return(-1);

    switch (facet->type) {
	case XML_SCHEMA_FACET_PATTERN:
	    /*
	    * NOTE that for patterns, the @value needs to be the normalized
	    * value, *not* the lexical initial value or the canonical value.
	    */
	    if (value == NULL)
		return(-1);
	    /*
	    * If string-derived type, regexp must be tested on the value space of
	    * the datatype.
	    * See https://www.w3.org/TR/xmlschema-2/#rf-pattern
	    */
	    stringType = val && ((val->type >= XML_SCHEMAS_STRING && val->type <= XML_SCHEMAS_NORMSTRING)
			      || (val->type >= XML_SCHEMAS_TOKEN && val->type <= XML_SCHEMAS_NCNAME));
	    ret = xmlRegexpExec(facet->regexp,
	                        (stringType && val->value.str) ? val->value.str : value);
	    if (ret == 1)
		return(0);
	    if (ret == 0)
		return(XML_SCHEMAV_CVC_PATTERN_VALID);
	    return(ret);
	case XML_SCHEMA_FACET_MAXEXCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if (ret == -1)
		return(0);
	    return(XML_SCHEMAV_CVC_MAXEXCLUSIVE_VALID);
	case XML_SCHEMA_FACET_MAXINCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if ((ret == -1) || (ret == 0))
		return(0);
	    return(XML_SCHEMAV_CVC_MAXINCLUSIVE_VALID);
	case XML_SCHEMA_FACET_MINEXCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if (ret == 1)
		return(0);
	    return(XML_SCHEMAV_CVC_MINEXCLUSIVE_VALID);
	case XML_SCHEMA_FACET_MININCLUSIVE:
	    ret = xmlSchemaCompareValues(val, facet->val);
	    if (ret == -2)
		return(-1);
	    if ((ret == 1) || (ret == 0))
		return(0);
	    return(XML_SCHEMAV_CVC_MININCLUSIVE_VALID);
	case XML_SCHEMA_FACET_WHITESPACE:
	    /* TODO whitespaces */
	    /*
	    * NOTE: Whitespace should be handled to normalize
	    * the value to be validated against a the facets;
	    * not to normalize the value in-between.
	    */
	    return(0);
	case  XML_SCHEMA_FACET_ENUMERATION:
	    if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
		/*
		* This is to ensure API compatibility with the old
		* xmlSchemaValidateFacet().
		* TODO: Get rid of this case.
		*/
		if ((facet->value != NULL) &&
		    (xmlStrEqual(facet->value, value)))
		    return(0);
	    } else {
		ret = xmlSchemaCompareValuesWhtspExt(facet->val->type,
		    facet->val, facet->value, fws, valType, val,
		    value, ws);
		if (ret == -2)
		    return(-1);
		if (ret == 0)
		    return(0);
	    }
	    return(XML_SCHEMAV_CVC_ENUMERATION_VALID);
	case XML_SCHEMA_FACET_LENGTH:
	    /*
	    * SPEC (1.3) "if {primitive type definition} is QName or NOTATION,
	    * then any {value} is facet-valid."
	    */
	    if ((valType == XML_SCHEMAS_QNAME) ||
		(valType == XML_SCHEMAS_NOTATION))
		return (0);
            /* Falls through. */
	case XML_SCHEMA_FACET_MAXLENGTH:
	case XML_SCHEMA_FACET_MINLENGTH: {
	    unsigned int len = 0;

	    if ((valType == XML_SCHEMAS_QNAME) ||
		(valType == XML_SCHEMAS_NOTATION))
		return (0);
	    /*
	    * TODO: length, maxLength and minLength must be of type
	    * nonNegativeInteger only. Check if decimal is used somehow.
	    */
	    if ((facet->val == NULL) ||
		((facet->val->type != XML_SCHEMAS_DECIMAL) &&
		 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
		(facet->val->value.decimal.frac != 0)) {
		return(-1);
	    }
	    if ((val != NULL) && (val->type == XML_SCHEMAS_HEXBINARY))
		len = val->value.hex.total;
	    else if ((val != NULL) && (val->type == XML_SCHEMAS_BASE64BINARY))
		len = val->value.base64.total;
	    else {
		switch (valType) {
		    case XML_SCHEMAS_STRING:
		    case XML_SCHEMAS_NORMSTRING:
			if (ws == XML_SCHEMA_WHITESPACE_UNKNOWN) {
			    /*
			    * This is to ensure API compatibility with the old
			    * xmlSchemaValidateFacet(). Anyway, this was and
			    * is not the correct handling.
			    * TODO: Get rid of this case somehow.
			    */
			    if (valType == XML_SCHEMAS_STRING)
				len = xmlUTF8Strlen(value);
			    else
				len = xmlSchemaNormLen(value);
			} else if (value != NULL) {
			    if (ws == XML_SCHEMA_WHITESPACE_COLLAPSE)
				len = xmlSchemaNormLen(value);
			    else
				/*
				* Should be OK for "preserve" as well.
				*/
				len = xmlUTF8Strlen(value);
			}
			break;
		    case XML_SCHEMAS_IDREF:
		    case XML_SCHEMAS_TOKEN:
		    case XML_SCHEMAS_LANGUAGE:
		    case XML_SCHEMAS_NMTOKEN:
		    case XML_SCHEMAS_NAME:
		    case XML_SCHEMAS_NCNAME:
		    case XML_SCHEMAS_ID:
		    case XML_SCHEMAS_ANYURI:
			if (value != NULL)
			    len = xmlSchemaNormLen(value);
			break;
		    default:
		        TODO
		}
	    }
	    if (facet->type == XML_SCHEMA_FACET_LENGTH) {
		if (len != facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_LENGTH_VALID);
	    } else if (facet->type == XML_SCHEMA_FACET_MINLENGTH) {
		if (len < facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_MINLENGTH_VALID);
	    } else {
		if (len > facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_MAXLENGTH_VALID);
	    }
	    break;
	}
	case XML_SCHEMA_FACET_TOTALDIGITS:
	case XML_SCHEMA_FACET_FRACTIONDIGITS:

	    if ((facet->val == NULL) ||
		((facet->val->type != XML_SCHEMAS_PINTEGER) &&
		 (facet->val->type != XML_SCHEMAS_NNINTEGER)) ||
		(facet->val->value.decimal.frac != 0)) {
		return(-1);
	    }
	    if ((val == NULL) ||
		((val->type != XML_SCHEMAS_DECIMAL) &&
		 (val->type != XML_SCHEMAS_INTEGER) &&
		 (val->type != XML_SCHEMAS_NPINTEGER) &&
		 (val->type != XML_SCHEMAS_NINTEGER) &&
		 (val->type != XML_SCHEMAS_NNINTEGER) &&
		 (val->type != XML_SCHEMAS_PINTEGER) &&
		 (val->type != XML_SCHEMAS_INT) &&
		 (val->type != XML_SCHEMAS_UINT) &&
		 (val->type != XML_SCHEMAS_LONG) &&
		 (val->type != XML_SCHEMAS_ULONG) &&
		 (val->type != XML_SCHEMAS_SHORT) &&
		 (val->type != XML_SCHEMAS_USHORT) &&
		 (val->type != XML_SCHEMAS_BYTE) &&
		 (val->type != XML_SCHEMAS_UBYTE))) {
		return(-1);
	    }
	    if (facet->type == XML_SCHEMA_FACET_TOTALDIGITS) {
	        if (val->value.decimal.total > facet->val->value.decimal.lo)
	            return(XML_SCHEMAV_CVC_TOTALDIGITS_VALID);

	    } else if (facet->type == XML_SCHEMA_FACET_FRACTIONDIGITS) {
	        if (val->value.decimal.frac > facet->val->value.decimal.lo)
		    return(XML_SCHEMAV_CVC_FRACTIONDIGITS_VALID);
	    }
	    break;
	default:
	    TODO
    }
    return(0);

}